

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

bool wallet::HasErrorMsg(Result<wallet::SelectionResult> *res)

{
  long in_FS_OFFSET;
  bilingual_str local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  util::ErrorString<wallet::SelectionResult>(&local_58,res);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.translated._M_dataplus._M_p != &local_58.translated.field_2) {
    operator_delete(local_58.translated._M_dataplus._M_p,
                    local_58.translated.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.original._M_dataplus._M_p != &local_58.original.field_2) {
    operator_delete(local_58.original._M_dataplus._M_p,
                    local_58.original.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_58.original._M_string_length != 0;
  }
  __stack_chk_fail();
}

Assistant:

static bool HasErrorMsg(const util::Result<SelectionResult>& res) { return !util::ErrorString(res).empty(); }